

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O0

MPI_Comm __thiscall henson::ProcMap::intracomm(ProcMap *this,string *to)

{
  bool bVar1;
  pointer ppVar2;
  runtime_error *this_00;
  vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_> *in_RDI;
  const_iterator it;
  reverse_iterator lit;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
  *in_stack_ffffffffffffff78;
  reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_60 [32];
  iterator in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
  in_stack_ffffffffffffffc8;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
  local_28 [5];
  
  std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>::rbegin(in_RDI);
  while( true ) {
    std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>::rend(in_RDI);
    bVar1 = std::operator!=(in_stack_ffffffffffffff80,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
                             *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_ffffffffffffffc8._M_node,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffc0._M_node);
      std::runtime_error::runtime_error(this_00,local_60);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator->(in_stack_ffffffffffffff80);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
         ::find(in_stack_ffffffffffffff78,(key_type *)0x19133d);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
    ::_Rb_tree_const_iterator(local_28,&local_30);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator->(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffc0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
         ::end(in_stack_ffffffffffffff78);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
                *)&stack0xffffffffffffffc8,(iterator *)&stack0xffffffffffffffc0);
    bVar1 = std::operator!=(local_28,(_Self *)&stack0xffffffffffffffc8);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<henson::ProcMap::Level_*,_std::vector<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>_>_>
    ::operator++(in_stack_ffffffffffffff80);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>
                         *)0x19139a);
  return (ppVar2->second).intra_comm;
}

Assistant:

MPI_Comm    intracomm(const std::string& to)
        {
            // Search for the intracomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.intra_comm;
            }
            throw std::runtime_error("No intracomm associated with " + to);
        }